

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarClassic.cpp
# Opt level: O2

void __thiscall
GMAA_MAAstarClassic::SelectPoliciesToProcessFurther
          (GMAA_MAAstarClassic *this,PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,
          bool are_LBs,double bestLB)

{
  int iVar1;
  undefined4 extraout_var;
  undefined3 in_register_00000011;
  undefined8 local_28;
  shared_count sStack_20;
  
  if (CONCAT31(in_register_00000011,are_LBs) != 0) {
    while( true ) {
      iVar1 = (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[0xb])();
      if (CONCAT44(extraout_var,iVar1) == 0) break;
      local_28 = 0;
      sStack_20.pi_ = (sp_counted_base *)0x0;
      (*poolOfNextPolicies->px->_vptr_PartialPolicyPoolInterface[5])
                (poolOfNextPolicies->px,&local_28);
      boost::detail::shared_count::~shared_count(&sStack_20);
    }
  }
  return;
}

Assistant:

void GMAA_MAAstarClassic::SelectPoliciesToProcessFurther(
    const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies, bool are_LBs, double bestLB)
{
    //for MAA*, all policies are processed further when they aren't full
    //policies (i.e. lower bounds)
    //so, unless these are full policies...

    if(are_LBs)
    {
        while(!poolOfNextPolicies->Empty())
            poolOfNextPolicies->Pop();
    }
    //we can return immediately...
    return;
}